

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUISpriteBank.cpp
# Opt level: O1

void __thiscall
irr::gui::CGUISpriteBank::draw2DSpriteBatch
          (CGUISpriteBank *this,array<unsigned_int> *indices,array<irr::core::vector2d<int>_> *pos,
          rect<int> *clip,SColor *color,u32 starttime,u32 currenttime,bool loop,bool center)

{
  pointer *pprVar1;
  pointer this_00;
  pointer prVar2;
  vector2d<int> vVar3;
  iterator __position;
  IVideoDriver *pIVar4;
  SColor *pSVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  undefined4 extraout_var;
  ulong uVar10;
  vector2d<int> *element;
  uint uVar11;
  ulong uVar12;
  long lVar13;
  rect<int> *__args;
  ulong uVar14;
  bool bVar15;
  array<irr::gui::CGUISpriteBank::SDrawBatch> drawBatches;
  undefined1 local_c8 [16];
  pointer local_b8;
  undefined1 local_b0;
  array<irr::core::vector2d<int>_> *local_a0;
  ulong local_98;
  SColor *local_90;
  ulong local_88;
  rect<int> *local_80;
  undefined1 local_78 [32];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  undefined8 local_38;
  
  local_88 = (ulong)((long)(indices->m_data).
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                    (long)(indices->m_data).
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start) >> 2;
  uVar14 = (ulong)((long)(pos->m_data).
                         super__Vector_base<irr::core::vector2d<int>,_std::allocator<irr::core::vector2d<int>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(pos->m_data).
                        super__Vector_base<irr::core::vector2d<int>,_std::allocator<irr::core::vector2d<int>_>_>
                        ._M_impl.super__Vector_impl_data._M_start) >> 3;
  uVar11 = (uint)uVar14;
  if ((uint)local_88 < uVar11) {
    uVar11 = (uint)local_88;
  }
  local_80 = clip;
  iVar6 = (*(this->super_IGUISpriteBank)._vptr_IGUISpriteBank[2])();
  if (iVar6 != 0) {
    local_a0 = pos;
    local_98 = uVar14;
    local_90 = color;
    uVar7 = (*(this->super_IGUISpriteBank)._vptr_IGUISpriteBank[2])(this);
    local_c8 = (undefined1  [16])0x0;
    local_b8 = (pointer)0x0;
    local_b0 = 1;
    ::std::
    vector<irr::gui::CGUISpriteBank::SDrawBatch,_std::allocator<irr::gui::CGUISpriteBank::SDrawBatch>_>
    ::reserve((vector<irr::gui::CGUISpriteBank::SDrawBatch,_std::allocator<irr::gui::CGUISpriteBank::SDrawBatch>_>
               *)local_c8,(ulong)uVar7);
    if ((int)((ulong)((long)(this->Textures).m_data.
                            super__Vector_base<irr::video::ITexture_*,_std::allocator<irr::video::ITexture_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->Textures).m_data.
                           super__Vector_base<irr::video::ITexture_*,_std::allocator<irr::video::ITexture_*>_>
                           ._M_impl.super__Vector_impl_data._M_start) >> 3) != 0) {
      lVar13 = 0;
      uVar14 = 0;
      do {
        local_78._0_16_ = (undefined1  [16])0x0;
        local_38._0_4_ = 0;
        local_38._4_4_ = 0;
        local_78._16_9_ = (unkuint9)1 << 0x40;
        local_78._25_7_ = 0;
        local_58 = (undefined1  [16])0x0;
        local_48._0_9_ = (unkuint9)1 << 0x40;
        local_48._9_7_ = 0;
        ::std::
        vector<irr::gui::CGUISpriteBank::SDrawBatch,_std::allocator<irr::gui::CGUISpriteBank::SDrawBatch>_>
        ::emplace_back<irr::gui::CGUISpriteBank::SDrawBatch>
                  ((vector<irr::gui::CGUISpriteBank::SDrawBatch,_std::allocator<irr::gui::CGUISpriteBank::SDrawBatch>_>
                    *)local_c8,(SDrawBatch *)local_78);
        local_b0 = 0;
        if ((pointer)local_58._0_8_ != (pointer)0x0) {
          operator_delete((void *)local_58._0_8_,local_48._0_8_ - local_58._0_8_);
        }
        if ((vector2d<int>)local_78._0_8_ != (vector2d<int>)0x0) {
          operator_delete((void *)local_78._0_8_,local_78._16_8_ - local_78._0_8_);
        }
        core::array<irr::core::vector2d<int>_>::reallocate
                  ((array<irr::core::vector2d<int>_> *)
                   ((long)&(((array<irr::core::vector2d<int>_> *)local_c8._0_8_)->m_data).
                           super__Vector_base<irr::core::vector2d<int>,_std::allocator<irr::core::vector2d<int>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + lVar13),uVar11,true);
        core::array<irr::core::rect<int>_>::reallocate
                  ((array<irr::core::rect<int>_> *)
                   ((long)&(((array<irr::core::rect<int>_> *)(local_c8._0_8_ + 0x20))->m_data).
                           super__Vector_base<irr::core::rect<int>,_std::allocator<irr::core::rect<int>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + lVar13),uVar11,true);
        uVar14 = uVar14 + 1;
        lVar13 = lVar13 + 0x48;
      } while (uVar14 < ((ulong)((long)(this->Textures).m_data.
                                       super__Vector_base<irr::video::ITexture_*,_std::allocator<irr::video::ITexture_*>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(this->Textures).m_data.
                                      super__Vector_base<irr::video::ITexture_*,_std::allocator<irr::video::ITexture_*>_>
                                      ._M_impl.super__Vector_impl_data._M_start) >> 3 & 0xffffffff))
      ;
    }
    pSVar5 = local_90;
    if (uVar11 != 0) {
      uVar14 = local_88;
      if ((uint)local_98 < (uint)local_88) {
        uVar14 = local_98;
      }
      uVar10 = 0;
      do {
        uVar11 = (indices->m_data).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_start[uVar10];
        uVar9 = (ulong)uVar11;
        lVar13 = *(long *)&(this->super_IGUISpriteBank).field_0x8;
        bVar15 = false;
        uVar7 = 0;
        if (uVar11 < (uint)((int)((ulong)(*(long *)&(this->super_IGUISpriteBank).field_0x10 - lVar13
                                         ) >> 3) * -0x33333333)) {
          uVar12 = (ulong)(*(long *)(lVar13 + 8 + uVar9 * 0x28) - *(long *)(lVar13 + uVar9 * 0x28))
                   >> 3;
          uVar11 = (uint)uVar12;
          bVar15 = uVar11 != 0;
          if (bVar15) {
            uVar8 = *(uint *)(lVar13 + uVar9 * 0x28 + 0x20);
            bVar15 = true;
            if (uVar8 == 0) {
              uVar7 = 0;
            }
            else {
              uVar8 = (currenttime - starttime) / uVar8;
              if (loop) {
                uVar7 = (uint)((ulong)uVar8 % (uVar12 & 0xffffffff));
              }
              else {
                uVar7 = uVar11 - 1;
                if (uVar8 < uVar11) {
                  uVar7 = uVar8;
                }
              }
            }
          }
        }
        iVar6 = 1;
        if (bVar15) {
          lVar13 = *(long *)(lVar13 + uVar9 * 0x28);
          uVar11 = *(uint *)(lVar13 + (ulong)uVar7 * 8);
          iVar6 = 7;
          if (uVar11 < (uint)((int)((ulong)(local_c8._8_8_ - local_c8._0_8_) >> 3) * 0x38e38e39)) {
            uVar7 = *(uint *)(lVar13 + 4 + (ulong)uVar7 * 8);
            prVar2 = (this->Rectangles).m_data.
                     super__Vector_base<irr::core::rect<int>,_std::allocator<irr::core::rect<int>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            iVar6 = 1;
            if (uVar7 < (uint)((ulong)((long)(this->Rectangles).m_data.
                                             super__Vector_base<irr::core::rect<int>,_std::allocator<irr::core::rect<int>_>_>
                                             ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)prVar2) >> 4)) {
              this_00 = (pointer)(local_c8._0_8_ + (ulong)uVar11 * 0x48);
              __args = prVar2 + uVar7;
              if (center) {
                vVar3 = (local_a0->m_data).
                        super__Vector_base<irr::core::vector2d<int>,_std::allocator<irr::core::vector2d<int>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[uVar10];
                local_78._4_4_ =
                     vVar3.Y - ((__args->LowerRightCorner).Y - (__args->UpperLeftCorner).Y) / 2;
                local_78._0_4_ =
                     vVar3.X - ((__args->LowerRightCorner).X - (__args->UpperLeftCorner).X) / 2;
                element = (vector2d<int> *)local_78;
              }
              else {
                element = (local_a0->m_data).
                          super__Vector_base<irr::core::vector2d<int>,_std::allocator<irr::core::vector2d<int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + uVar10;
              }
              core::array<irr::core::vector2d<int>_>::push_back
                        ((array<irr::core::vector2d<int>_> *)this_00,element);
              __position._M_current =
                   (this_00->sourceRects).m_data.
                   super__Vector_base<irr::core::rect<int>,_std::allocator<irr::core::rect<int>_>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
              if (__position._M_current ==
                  (this_00->sourceRects).m_data.
                  super__Vector_base<irr::core::rect<int>,_std::allocator<irr::core::rect<int>_>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage) {
                ::std::vector<irr::core::rect<int>,std::allocator<irr::core::rect<int>>>::
                _M_realloc_insert<irr::core::rect<int>const&>
                          ((vector<irr::core::rect<int>,std::allocator<irr::core::rect<int>>> *)
                           &this_00->sourceRects,__position,__args);
              }
              else {
                vVar3 = __args->LowerRightCorner;
                (__position._M_current)->UpperLeftCorner = __args->UpperLeftCorner;
                (__position._M_current)->LowerRightCorner = vVar3;
                pprVar1 = &(this_00->sourceRects).m_data.
                           super__Vector_base<irr::core::rect<int>,_std::allocator<irr::core::rect<int>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
                *pprVar1 = *pprVar1 + 1;
              }
              (this_00->sourceRects).is_sorted = false;
              iVar6 = 0;
            }
          }
        }
        if ((iVar6 != 7) && (iVar6 != 0)) goto LAB_0022ac36;
        uVar10 = uVar10 + 1;
      } while (uVar10 != (uVar14 & 0xffffffff));
    }
    if ((int)((ulong)(local_c8._8_8_ - local_c8._0_8_) >> 3) * 0x38e38e39 != 0) {
      lVar13 = 0x20;
      uVar14 = 0;
      do {
        if ((*(long *)(local_c8._0_8_ + lVar13 + -0x20) !=
             *(long *)(local_c8._0_8_ + lVar13 + -0x18)) &&
           (*(long *)((long)&(((pointer)local_c8._0_8_)->positions).m_data.
                             super__Vector_base<irr::core::vector2d<int>,_std::allocator<irr::core::vector2d<int>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + lVar13) !=
            *(long *)((long)&(((pointer)local_c8._0_8_)->positions).m_data.
                             super__Vector_base<irr::core::vector2d<int>,_std::allocator<irr::core::vector2d<int>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish + lVar13))) {
          pIVar4 = this->Driver;
          iVar6 = (*(this->super_IGUISpriteBank)._vptr_IGUISpriteBank[3])(this,uVar14 & 0xffffffff);
          (*pIVar4->_vptr_IVideoDriver[0x31])
                    (pIVar4,CONCAT44(extraout_var,iVar6),local_c8._0_8_ + lVar13 + -0x20,
                     (long)&(((array<irr::core::vector2d<int>_> *)local_c8._0_8_)->m_data).
                            super__Vector_base<irr::core::vector2d<int>,_std::allocator<irr::core::vector2d<int>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + lVar13,local_80,
                     (ulong)pSVar5->color,1);
        }
        uVar14 = uVar14 + 1;
        lVar13 = lVar13 + 0x48;
      } while (uVar14 < (uint)((int)((ulong)(local_c8._8_8_ - local_c8._0_8_) >> 3) * 0x38e38e39));
    }
LAB_0022ac36:
    ::std::
    vector<irr::gui::CGUISpriteBank::SDrawBatch,_std::allocator<irr::gui::CGUISpriteBank::SDrawBatch>_>
    ::~vector((vector<irr::gui::CGUISpriteBank::SDrawBatch,_std::allocator<irr::gui::CGUISpriteBank::SDrawBatch>_>
               *)local_c8);
  }
  return;
}

Assistant:

void CGUISpriteBank::draw2DSpriteBatch(const core::array<u32> &indices,
		const core::array<core::position2di> &pos,
		const core::rect<s32> *clip,
		const video::SColor &color,
		u32 starttime, u32 currenttime,
		bool loop, bool center)
{
	const irr::u32 drawCount = core::min_<u32>(indices.size(), pos.size());

	if (!getTextureCount())
		return;
	core::array<SDrawBatch> drawBatches(getTextureCount());
	for (u32 i = 0; i < Textures.size(); ++i) {
		drawBatches.push_back(SDrawBatch());
		drawBatches[i].positions.reallocate(drawCount);
		drawBatches[i].sourceRects.reallocate(drawCount);
	}

	for (u32 i = 0; i < drawCount; ++i) {
		const u32 index = indices[i];

		// work out frame number
		u32 frame = 0;
		if (!getFrameNr(frame, index, currenttime - starttime, loop))
			return;

		const u32 texNum = Sprites[index].Frames[frame].textureNumber;
		if (texNum >= drawBatches.size()) {
			continue;
		}
		SDrawBatch &currentBatch = drawBatches[texNum];

		const u32 rn = Sprites[index].Frames[frame].rectNumber;
		if (rn >= Rectangles.size())
			return;

		const core::rect<s32> &r = Rectangles[rn];

		if (center) {
			core::position2di p = pos[i];
			p -= r.getSize() / 2;

			currentBatch.positions.push_back(p);
			currentBatch.sourceRects.push_back(r);
		} else {
			currentBatch.positions.push_back(pos[i]);
			currentBatch.sourceRects.push_back(r);
		}
	}

	for (u32 i = 0; i < drawBatches.size(); i++) {
		if (!drawBatches[i].positions.empty() && !drawBatches[i].sourceRects.empty())
			Driver->draw2DImageBatch(getTexture(i), drawBatches[i].positions,
					drawBatches[i].sourceRects, clip, color, true);
	}
}